

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.h
# Opt level: O0

Type __thiscall wasm::PossibleContents::getType(PossibleContents *this)

{
  add_pointer_t<const_wasm::Literal> ptVar1;
  add_pointer_t<const_wasm::PossibleContents::GlobalInfo> ptVar2;
  add_pointer_t<const_wasm::PossibleContents::ConeType> ptVar3;
  add_pointer_t<const_wasm::PossibleContents::None> ptVar4;
  add_pointer_t<const_wasm::PossibleContents::Many> ptVar5;
  ConeType *coneType;
  GlobalInfo *global;
  Literal *literal;
  PossibleContents *this_local;
  
  ptVar1 = std::
           get_if<wasm::Literal,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                     (&this->value);
  if (ptVar1 == (add_pointer_t<const_wasm::Literal>)0x0) {
    ptVar2 = std::
             get_if<wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                       (&this->value);
    if (ptVar2 == (add_pointer_t<const_wasm::PossibleContents::GlobalInfo>)0x0) {
      ptVar3 = std::
               get_if<wasm::PossibleContents::ConeType,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                         (&this->value);
      if (ptVar3 == (add_pointer_t<const_wasm::PossibleContents::ConeType>)0x0) {
        ptVar4 = std::
                 get_if<wasm::PossibleContents::None,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                           (&this->value);
        if (ptVar4 == (add_pointer_t<const_wasm::PossibleContents::None>)0x0) {
          ptVar5 = std::
                   get_if<wasm::PossibleContents::Many,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                             (&this->value);
          if (ptVar5 == (add_pointer_t<const_wasm::PossibleContents::Many>)0x0) {
            handle_unreachable("bad value",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.h"
                               ,0xf1);
          }
          wasm::Type::Type((Type *)&this_local,none);
        }
        else {
          wasm::Type::Type((Type *)&this_local,unreachable);
        }
      }
      else {
        this_local = (PossibleContents *)(ptVar3->type).id;
      }
    }
    else {
      this_local = (PossibleContents *)(ptVar2->type).id;
    }
  }
  else {
    this_local = (PossibleContents *)(ptVar1->type).id;
  }
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type getType() const {
    if (auto* literal = std::get_if<Literal>(&value)) {
      return literal->type;
    } else if (auto* global = std::get_if<GlobalInfo>(&value)) {
      return global->type;
    } else if (auto* coneType = std::get_if<ConeType>(&value)) {
      return coneType->type;
    } else if (std::get_if<None>(&value)) {
      return Type::unreachable;
    } else if (std::get_if<Many>(&value)) {
      return Type::none;
    } else {
      WASM_UNREACHABLE("bad value");
    }
  }